

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::ObjectivePropagation::getPropagationConstraint
          (ObjectivePropagation *this,HighsInt domchgStackSize,double **vals,HighsInt **inds,
          HighsInt *len,double *rhs,HighsInt domchgCol)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  HighsObjectiveFunction *pHVar5;
  HighsInt *pHVar6;
  pointer piVar7;
  pointer piVar8;
  HighsDomain *pHVar9;
  pointer pdVar10;
  pointer pPVar11;
  pointer ppVar12;
  pointer pdVar13;
  int *piVar14;
  pointer ppVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  pHVar5 = this->objFunc;
  pHVar6 = (pHVar5->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (pHVar5->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar8 = (pHVar5->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *inds = pHVar6;
  pHVar5 = this->objFunc;
  *len = (HighsInt)
         ((ulong)((long)(pHVar5->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pHVar5->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2);
  uVar19 = (int)((ulong)((long)piVar7 - (long)piVar8) >> 2) - 1;
  if (uVar19 == 0) {
    *vals = (pHVar5->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
    dVar24 = ((this->domain->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
  }
  else {
    pHVar9 = this->domain;
    dVar24 = ((pHVar9->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
    if ((int)uVar19 < 1) {
      dVar20 = 0.0;
    }
    else {
      piVar7 = (pHVar5->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->propagationConsBuffer).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar11 = (this->partitionCliqueData).
                super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = 0;
      dVar20 = 0.0;
      dVar21 = dVar24;
      do {
        iVar2 = piVar7[uVar17];
        lVar16 = (long)iVar2;
        iVar3 = piVar7[uVar17 + 1];
        dVar22 = 0.0;
        if (iVar2 < iVar3) {
          lVar18 = lVar16;
          dVar24 = dVar22;
          do {
            iVar4 = pHVar6[lVar18];
            dVar22 = dVar24;
            if (iVar4 != domchgCol) {
              dVar23 = this->cost[iVar4];
              if (dVar23 <= 0.0) {
                ppVar15 = (pointer)((pHVar9->col_upper_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + iVar4);
                piVar14 = (pHVar9->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start + iVar4;
                ppVar12 = (pHVar9->prevboundval_).
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                while( true ) {
                  iVar4 = *piVar14;
                  if ((iVar4 <= domchgStackSize) &&
                     (((dVar1 = ppVar15->first, iVar4 == -1 || (ppVar12[iVar4].first != dVar1)) ||
                      (NAN(ppVar12[iVar4].first) || NAN(dVar1))))) break;
                  ppVar15 = ppVar12 + iVar4;
                  piVar14 = &ppVar12[iVar4].second;
                }
                if (0.0 < dVar1) {
                  dVar23 = -dVar23;
                  goto LAB_0029748c;
                }
              }
              else {
                ppVar15 = (pointer)((pHVar9->col_lower_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + iVar4);
                piVar14 = (pHVar9->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start + iVar4;
                ppVar12 = (pHVar9->prevboundval_).
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                while( true ) {
                  iVar4 = *piVar14;
                  if ((iVar4 <= domchgStackSize) &&
                     (((dVar1 = ppVar15->first, iVar4 == -1 || (ppVar12[iVar4].first != dVar1)) ||
                      (NAN(ppVar12[iVar4].first) || NAN(dVar1))))) break;
                  ppVar15 = ppVar12 + iVar4;
                  piVar14 = &ppVar12[iVar4].second;
                }
                if (dVar1 < 1.0) {
LAB_0029748c:
                  dVar22 = dVar23;
                  if (dVar23 <= dVar24) {
                    dVar22 = dVar24;
                  }
                }
              }
            }
            lVar18 = lVar18 + 1;
            dVar24 = dVar22;
          } while (lVar18 != iVar3);
        }
        iVar4 = pPVar11[uVar17].rhs;
        if (((pPVar11[uVar17].multiplier != dVar22) ||
            (NAN(pPVar11[uVar17].multiplier) || NAN(dVar22))) &&
           (pPVar11[uVar17].multiplier = dVar22, iVar2 < iVar3)) {
          pdVar13 = (pHVar5->objectiveVals).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            dVar24 = pdVar13[lVar16];
            pdVar10[lVar16] =
                 dVar24 - (double)((ulong)ABS(dVar22) | (ulong)dVar24 & 0x8000000000000000);
            lVar16 = lVar16 + 1;
          } while (iVar3 != lVar16);
        }
        uVar17 = uVar17 + 1;
        dVar22 = dVar22 * (double)iVar4;
        dVar24 = dVar21 + dVar22;
        dVar20 = dVar20 + (dVar21 - (dVar24 - dVar22)) + (dVar22 - (dVar24 - (dVar24 - dVar22)));
        dVar21 = dVar24;
      } while (uVar17 != uVar19);
    }
    dVar24 = dVar24 + dVar20;
    *vals = (this->propagationConsBuffer).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  }
  *rhs = dVar24;
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::getPropagationConstraint(
    HighsInt domchgStackSize, const double*& vals, const HighsInt*& inds,
    HighsInt& len, double& rhs, HighsInt domchgCol) {
  const HighsInt numPartitions = objFunc->getNumCliquePartitions();
  inds = objFunc->getObjectiveNonzeros().data();
  len = objFunc->getObjectiveNonzeros().size();
  if (numPartitions == 0) {
    vals = objFunc->getObjectiveValuesPacked().data();
    rhs = domain->mipsolver->mipdata_->upper_limit;
    return;
  }
  const auto& partitionStarts = objFunc->getCliquePartitionStarts();

  HighsCDouble tmpRhs = domain->mipsolver->mipdata_->upper_limit;
  for (HighsInt i = 0; i < numPartitions; ++i) {
    HighsInt start = partitionStarts[i];
    HighsInt end = partitionStarts[i + 1];
    double largest = 0.0;
    for (HighsInt j = start; j < end; ++j) {
      HighsInt c = inds[j];
      HighsInt pos;
      // skip the column we might want to explain a bound change for and take
      // the second largest column instead.
      if (c == domchgCol) continue;
      if (cost[c] > 0) {
        double lb = domain->getColLowerPos(c, domchgStackSize, pos);
        if (lb < 1) largest = std::max(largest, cost[c]);
      } else {
        double ub = domain->getColUpperPos(c, domchgStackSize, pos);
        if (ub > 0) largest = std::max(largest, -cost[c]);
      }
    }

    tmpRhs += largest * partitionCliqueData[i].rhs;
    if (partitionCliqueData[i].multiplier != largest) {
      partitionCliqueData[i].multiplier = largest;
      const auto& packedObjVals = objFunc->getObjectiveValuesPacked();
      for (HighsInt j = start; j < end; ++j)
        propagationConsBuffer[j] =
            packedObjVals[j] - std::copysign(largest, packedObjVals[j]);
    }
  }

  vals = propagationConsBuffer.data();
  rhs = double(tmpRhs);
}